

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.cpp
# Opt level: O0

int cli::pack(Parser *parse,Option *options)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  Option *pOVar4;
  char *__s;
  ostream *this;
  Compression local_b8;
  allocator<char> local_b1;
  Compression compression;
  string path;
  undefined1 local_88 [4];
  int i;
  ArchiveBuilder archive;
  bool recursive;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string outPath;
  Option *options_local;
  Parser *parse_local;
  
  outPath.field_2._8_8_ = options;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"./archive.zap",&local_41);
  std::allocator<char>::~allocator(&local_41);
  if (*(long *)(outPath.field_2._8_8_ + 0xe0) != 0) {
    std::__cxx11::string::operator=((string *)local_40,*(char **)(outPath.field_2._8_8_ + 0xe0));
  }
  pOVar4 = option::Option::operator_cast_to_Option_((Option *)(outPath.field_2._8_8_ + 0x120));
  archive.files._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = pOVar4 != (Option *)0x0;
  ZAP::ArchiveBuilder::ArchiveBuilder((ArchiveBuilder *)local_88);
  for (path.field_2._12_4_ = 0; uVar1 = path.field_2._12_4_,
      iVar3 = option::Parser::nonOptionsCount(parse), (int)uVar1 < iVar3;
      path.field_2._12_4_ = path.field_2._12_4_ + 1) {
    __s = option::Parser::nonOption(parse,path.field_2._12_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&compression,__s,&local_b1);
    std::allocator<char>::~allocator(&local_b1);
    cleanPath((string *)&compression);
    bVar2 = isDirectory((string *)&compression);
    if (bVar2) {
      anon_unknown_2::addDirectory
                ((ArchiveBuilder *)local_88,(string *)&compression,
                 (bool)(archive.files._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ & 1));
    }
    else {
      anon_unknown_2::addPath((ArchiveBuilder *)local_88,(string *)&compression);
    }
    std::__cxx11::string::~string((string *)&compression);
  }
  local_b8 = NONE;
  if (*(long *)(outPath.field_2._8_8_ + 0x110) != 0) {
    local_b8 = atoi(*(char **)(outPath.field_2._8_8_ + 0x110));
  }
  bVar2 = ZAP::ArchiveBuilder::buildFile((ArchiveBuilder *)local_88,(string *)local_40,local_b8);
  if (!bVar2) {
    this = std::operator<<((ostream *)&std::cerr,"Could not build archive");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  parse_local._4_4_ = (uint)!bVar2;
  ZAP::ArchiveBuilder::~ArchiveBuilder((ArchiveBuilder *)local_88);
  std::__cxx11::string::~string((string *)local_40);
  return parse_local._4_4_;
}

Assistant:

int pack(option::Parser &parse, option::Option *options)
	{
		std::string outPath = "./archive.zap";
		if (options[PACK].arg != nullptr)
			outPath = options[PACK].arg;

		bool recursive = (options[RECURSIVE] != nullptr);

		ZAP::ArchiveBuilder archive;

		for (int i = 0; i < parse.nonOptionsCount(); ++i)
		{
			std::string path = parse.nonOption(i);
			cleanPath(path);

			if (isDirectory(path))
				addDirectory(archive, path, recursive);
			else
				addPath(archive, path);
		}

		ZAP::Compression compression = ZAP::Compression::NONE;
		if (options[COMPRESS].arg != nullptr)
			compression = static_cast<ZAP::Compression>(std::atoi(options[COMPRESS].arg));

		if (!archive.buildFile(outPath, compression))
		{
			std::cerr << "Could not build archive" << std::endl;
			return 1;
		}

		return 0;
	}